

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int *piVar2;
  ostream *poVar3;
  int i;
  int iVar4;
  int x;
  int n;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> m;
  int local_60;
  int local_5c;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_> local_58;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x106180) = 0;
  CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::unordered_map(&local_58);
  std::istream::operator>>((istream *)&std::cin,&local_5c);
  for (iVar4 = 0; iVar4 < local_5c; iVar4 = iVar4 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_60);
    iVar1 = local_60;
    piVar2 = CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::operator[]
                       (&local_58,&local_60);
    *piVar2 = iVar1;
    poVar3 = std::operator<<((ostream *)&std::cout,"max bucket length = ");
    CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::max_bucket_length(&local_58);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  CP::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>_>::~unordered_map(&local_58);
  return 0;
}

Assistant:

int main() {
  std::ios_base::sync_with_stdio(false);std::cin.tie(NULL);

  CP::unordered_map<int,int> m;
  int n;
  std::cin >> n;
  for (int i = 0;i < n;i++) {
    int x;
    std::cin >> x;
    m[x] = x;
    std::cout << "max bucket length = " << m.max_bucket_length() << std::endl;
  }
}